

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O3

_Bool adt_str_equal_cstr(adt_str_t *self,char *cstr)

{
  uint8_t uVar1;
  uint uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  uint8_t d;
  ulong uVar5;
  
  if (cstr != (char *)0x0 && self != (adt_str_t *)0x0) {
    uVar2 = self->s32Cur;
    if (*cstr == '\0' && uVar2 == 0) {
      return true;
    }
    if ((0 < (int)uVar2) && (puVar3 = self->pAlloc, puVar3 != (uint8_t *)0x0)) {
      uVar4 = 0;
      do {
        uVar5 = uVar4;
        uVar1 = cstr[uVar5];
        if ((puVar3 + uVar2 <= puVar3 + uVar5) || (puVar3[uVar5] != uVar1)) break;
        uVar4 = uVar5 + 1;
      } while (uVar1 != '\0');
      if (uVar2 == uVar5 && uVar1 == '\0') {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool adt_str_equal_cstr(const adt_str_t *self, const char *cstr)
{
   if ( (self != 0) && (cstr != 0))
   {
      if ( (*cstr == 0) && (self->s32Cur == 0) )
      {
         return true;
      }
      else if (self->s32Cur > 0 && self->pAlloc != 0)
      {
         const uint8_t *pStr = (const uint8_t*) cstr;
         const uint8_t *pNext = self->pAlloc;
         const uint8_t *pEnd = self->pAlloc + self->s32Cur;
         while(pNext < pEnd)
         {
            uint8_t c = *pNext;
            uint8_t d = *pStr;
            if ( (c != d) || (d == 0) )
            {
               break;
            }
            ++pNext;
            ++pStr;
         }
         if ( (*pStr == 0) && (pNext == pEnd) )
         {
            return true;
         }
      }
   }
   return false;
}